

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::sequence::scan(sequence *this,location *loc)

{
  bool bVar1;
  long in_RSI;
  region *in_RDI;
  region reg;
  scanner_storage *other;
  const_iterator __end2;
  const_iterator __begin2;
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *__range2;
  location first;
  location *in_stack_fffffffffffffee8;
  region *this_00;
  undefined4 in_stack_ffffffffffffff08;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff0c;
  location *in_stack_ffffffffffffff10;
  location *in_stack_ffffffffffffff18;
  region *in_stack_ffffffffffffff20;
  __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
  local_70;
  long local_68;
  
  this_00 = in_RDI;
  location::location(in_stack_ffffffffffffff10,
                     (location *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_68 = in_RSI + 8;
  local_70._M_current =
       (scanner_storage *)
       std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
       begin((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              *)in_stack_fffffffffffffee8);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::end
            ((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              *)in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                           ((__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
                             *)in_stack_fffffffffffffee8), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator*(&local_70);
    scanner_storage::scan((scanner_storage *)this_00,(location *)in_RDI);
    bVar1 = region::is_ok((region *)0x376904);
    if (!bVar1) {
      location::operator=((location *)in_RDI,in_stack_fffffffffffffee8);
      region::region(in_stack_ffffffffffffff20);
    }
    uVar2 = (uint)!bVar1;
    region::~region(in_RDI);
    if (uVar2 != 0) goto LAB_003769b6;
    __gnu_cxx::
    __normal_iterator<const_toml::detail::scanner_storage_*,_std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>_>
    ::operator++(&local_70);
  }
  region::region(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
LAB_003769b6:
  location::~location((location *)in_RDI);
  return this_00;
}

Assistant:

TOML11_INLINE region sequence::scan(location& loc) const
{
    const auto first = loc;
    for(const auto& other : others_)
    {
        const auto reg = other.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    return region(first, loc);
}